

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall
xmrig::ClientWriteBaton::ClientWriteBaton(ClientWriteBaton *this,string *header,string *body)

{
  undefined8 uVar1;
  void *pvVar2;
  ulong uVar3;
  string *in_RDX;
  string *in_RSI;
  Baton<uv_write_s> *in_RDI;
  
  Baton<uv_write_s>::Baton(in_RDI);
  std::__cxx11::string::string((string *)(in_RDI[1].req.reserved + 2),in_RDX);
  std::__cxx11::string::string((string *)&in_RDI[1].req.cb,in_RSI);
  uVar1 = std::__cxx11::string::size();
  *(undefined8 *)&in_RDI[1].req.type = uVar1;
  pvVar2 = (void *)std::__cxx11::string::c_str();
  in_RDI[1].req.data = pvVar2;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pvVar2 = (void *)std::__cxx11::string::size();
    in_RDI[1].req.reserved[1] = pvVar2;
    pvVar2 = (void *)std::__cxx11::string::c_str();
    in_RDI[1].req.reserved[0] = pvVar2;
  }
  else {
    in_RDI[1].req.reserved[0] = (void *)0x0;
    in_RDI[1].req.reserved[1] = (void *)0x0;
  }
  return;
}

Assistant:

inline ClientWriteBaton(const std::string &header, std::string &&body) :
        m_body(std::move(body)),
        m_header(header)
    {
        bufs[0].len  = m_header.size();
        bufs[0].base = const_cast<char *>(m_header.c_str());

        if (!m_body.empty()) {
            bufs[1].len  = m_body.size();
            bufs[1].base = const_cast<char *>(m_body.c_str());
        }
        else {
            bufs[1].base = nullptr;
            bufs[1].len  = 0;
        }
    }